

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

void duckdb::FSSTStorage::SetDictionary
               (ColumnSegment *segment,BufferHandle *handle,StringDictionaryContainer container)

{
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&handle->node);
  *(StringDictionaryContainer *)(((handle->node).ptr)->buffer + segment->offset) = container;
  return;
}

Assistant:

void FSSTStorage::SetDictionary(ColumnSegment &segment, BufferHandle &handle, StringDictionaryContainer container) {
	auto header_ptr = reinterpret_cast<fsst_compression_header_t *>(handle.Ptr() + segment.GetBlockOffset());
	Store<uint32_t>(container.size, data_ptr_cast(&header_ptr->dict_size));
	Store<uint32_t>(container.end, data_ptr_cast(&header_ptr->dict_end));
}